

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReporterFactory.cpp
# Opt level: O1

unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_> __thiscall
ApprovalTests::ReporterFactory::createReporter(ReporterFactory *this,string *reporterName)

{
  mapped_type *pmVar1;
  string *in_RDX;
  string key;
  string osPrefix;
  string local_60;
  string local_40;
  
  getOsPrefix_abi_cxx11_();
  findReporterName(&local_60,(ReporterFactory *)reporterName,&local_40,in_RDX);
  if (local_60._M_string_length == 0) {
    *(undefined8 *)&(this->map)._M_t._M_impl = 0;
  }
  else {
    pmVar1 = ::std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>_>_>_>
             ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::unique_ptr<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>_>_()>_>_>_>
                   *)reporterName,&local_60);
    if ((pmVar1->super__Function_base)._M_manager == (_Manager_type)0x0) {
      ::std::__throw_bad_function_call();
    }
    (*pmVar1->_M_invoker)((_Any_data *)this);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return (__uniq_ptr_data<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>,_true,_true>
          )(__uniq_ptr_data<ApprovalTests::Reporter,_std::default_delete<ApprovalTests::Reporter>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<Reporter>
    ReporterFactory::createReporter(const std::string& reporterName) const
    {
        auto osPrefix = getOsPrefix();

        auto key = findReporterName(osPrefix, reporterName);

        if (!key.empty())
        {
            return map.at(key)();
        }

        return std::unique_ptr<Reporter>();
    }